

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_statics.cpp
# Opt level: O0

ON_SubDSectorSurfacePoint *
Internal_ON_SubDSectorLimitPoint_Init(ON_SubDSectorSurfacePoint *__return_storage_ptr__,double x)

{
  ON_SubDSectorSurfacePoint *lp;
  double x_local;
  
  memset(__return_storage_ptr__,0,0x70);
  __return_storage_ptr__->m_limitP[0] = x;
  __return_storage_ptr__->m_limitP[1] = x;
  __return_storage_ptr__->m_limitP[2] = x;
  __return_storage_ptr__->m_limitT1[0] = x;
  __return_storage_ptr__->m_limitT1[1] = x;
  __return_storage_ptr__->m_limitT1[2] = x;
  __return_storage_ptr__->m_limitT2[0] = x;
  __return_storage_ptr__->m_limitT2[1] = x;
  __return_storage_ptr__->m_limitT2[2] = x;
  __return_storage_ptr__->m_limitN[0] = x;
  __return_storage_ptr__->m_limitN[1] = x;
  __return_storage_ptr__->m_limitN[2] = x;
  return __return_storage_ptr__;
}

Assistant:

static ON_SubDSectorSurfacePoint Internal_ON_SubDSectorLimitPoint_Init(double x)
{
  ON_SubDSectorSurfacePoint lp;
  memset(&lp, 0, sizeof(lp));

  lp.m_limitP[0] = x;
  lp.m_limitP[1] = x;
  lp.m_limitP[2] = x;

  lp.m_limitT1[0] = x;
  lp.m_limitT1[1] = x;
  lp.m_limitT1[2] = x;

  lp.m_limitT2[0] = x;
  lp.m_limitT2[1] = x;
  lp.m_limitT2[2] = x;

  lp.m_limitN[0] = x;
  lp.m_limitN[1] = x;
  lp.m_limitN[2] = x;

  return lp;
}